

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O0

int __thiscall libtorrent::aux::piece_picker::num_peers(piece_picker *this,piece_block block)

{
  bool bVar1;
  value_type *this_00;
  reference dp;
  block_info *pbVar2;
  block_info *info;
  span<const_libtorrent::aux::piece_picker::block_info> binfo;
  __normal_iterator<const_libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
  local_38;
  const_iterator i;
  piece_pos *p;
  piece_picker *this_local;
  int iStack_10;
  piece_block block_local;
  
  this_local._4_4_ = (int)block.piece_index.m_val;
  i._M_current._4_4_ = this_local._4_4_;
  this_00 = container_wrapper<libtorrent::aux::piece_picker::piece_pos,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>_>
            ::operator[](&this->m_piece_map,this_local._4_4_);
  bVar1 = piece_pos::downloading(this_00);
  if (bVar1) {
    binfo.m_len._7_1_ = piece_pos::download_queue(this_00);
    binfo.m_len._0_4_ = this_local._4_4_;
    local_38._M_current =
         (downloading_piece *)find_dl_piece(this,binfo.m_len._7_1_,(piece_index_t)this_local._4_4_);
    dp = __gnu_cxx::
         __normal_iterator<const_libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
         ::operator*(&local_38);
    _info = blocks_for_piece(this,dp);
    iStack_10 = block.block_index;
    pbVar2 = span<const_libtorrent::aux::piece_picker::block_info>::operator[]
                       ((span<const_libtorrent::aux::piece_picker::block_info> *)&info,
                        (long)iStack_10);
    block_local.piece_index.m_val = (int)(*(ushort *)&pbVar2->field_0x8 & 0x3fff);
  }
  else {
    block_local.piece_index.m_val = 0;
  }
  return block_local.piece_index.m_val;
}

Assistant:

int piece_picker::num_peers(piece_block const block) const
	{
		TORRENT_ASSERT(block.block_index != piece_block::invalid.block_index);
		TORRENT_ASSERT(block.piece_index != piece_block::invalid.piece_index);
		TORRENT_ASSERT(block.piece_index < m_piece_map.end_index());
		TORRENT_ASSERT(block.block_index < blocks_in_piece(block.piece_index));

		piece_pos const& p = m_piece_map[block.piece_index];
		if (!p.downloading()) return 0;

		auto const i = find_dl_piece(p.download_queue(), block.piece_index);
		TORRENT_ASSERT(i != m_downloads[p.download_queue()].end());

		auto const binfo = blocks_for_piece(*i);
		block_info const& info = binfo[block.block_index];
		TORRENT_ASSERT(&info >= &m_block_info[0]);
		TORRENT_ASSERT(&info < &m_block_info[0] + m_block_info.size());
		TORRENT_ASSERT(info.piece_index == block.piece_index);
		return info.num_peers;
	}